

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putRGBcontig8bitCMYKtile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint32_t uVar6;
  long lVar7;
  bool bVar8;
  
  uVar3 = (ulong)img->samplesperpixel;
  lVar1 = uVar3 * 3;
  lVar2 = uVar3 * 5;
  lVar7 = uVar3 * 6;
  lVar4 = uVar3 * 7;
LAB_0025d04f:
  bVar8 = h == 0;
  h = h - 1;
  uVar6 = w;
  if (bVar8) {
    return;
  }
LAB_0025d063:
  switch(uVar6) {
  case 0:
    goto switchD_0025d356_caseD_0;
  case 1:
    goto LAB_0025d5b2;
  case 2:
    goto LAB_0025d558;
  case 3:
    goto LAB_0025d4fe;
  case 4:
    goto LAB_0025d4a4;
  case 5:
    break;
  case 7:
    uVar5 = pp[3] ^ 0xff;
    *cp = ((pp[2] ^ 0xff) * uVar5) / 0xff << 0x10 |
          ((pp[1] ^ 0xff) * uVar5) / 0xff << 8 | ((*pp ^ 0xff) * uVar5) / 0xff | 0xff000000;
    cp = cp + 1;
    pp = pp + uVar3;
  case 6:
    uVar5 = pp[3] ^ 0xff;
    *cp = ((pp[2] ^ 0xff) * uVar5) / 0xff << 0x10 |
          ((pp[1] ^ 0xff) * uVar5) / 0xff << 8 | ((*pp ^ 0xff) * uVar5) / 0xff | 0xff000000;
    cp = cp + 1;
    pp = pp + uVar3;
    break;
  default:
    goto switchD_0025d356_default;
  }
  uVar5 = pp[3] ^ 0xff;
  *cp = ((pp[2] ^ 0xff) * uVar5) / 0xff << 0x10 |
        ((pp[1] ^ 0xff) * uVar5) / 0xff << 8 | ((*pp ^ 0xff) * uVar5) / 0xff | 0xff000000;
  cp = cp + 1;
  pp = pp + uVar3;
LAB_0025d4a4:
  uVar5 = pp[3] ^ 0xff;
  *cp = ((pp[2] ^ 0xff) * uVar5) / 0xff << 0x10 |
        ((pp[1] ^ 0xff) * uVar5) / 0xff << 8 | ((*pp ^ 0xff) * uVar5) / 0xff | 0xff000000;
  cp = cp + 1;
  pp = pp + uVar3;
LAB_0025d4fe:
  uVar5 = pp[3] ^ 0xff;
  *cp = ((pp[2] ^ 0xff) * uVar5) / 0xff << 0x10 |
        ((pp[1] ^ 0xff) * uVar5) / 0xff << 8 | ((*pp ^ 0xff) * uVar5) / 0xff | 0xff000000;
  cp = cp + 1;
  pp = pp + uVar3;
LAB_0025d558:
  uVar5 = pp[3] ^ 0xff;
  *cp = ((pp[2] ^ 0xff) * uVar5) / 0xff << 0x10 |
        ((pp[1] ^ 0xff) * uVar5) / 0xff << 8 | ((*pp ^ 0xff) * uVar5) / 0xff | 0xff000000;
  cp = cp + 1;
  pp = pp + uVar3;
LAB_0025d5b2:
  uVar5 = pp[3] ^ 0xff;
  *cp = ((pp[2] ^ 0xff) * uVar5) / 0xff << 0x10 |
        ((pp[1] ^ 0xff) * uVar5) / 0xff << 8 | ((*pp ^ 0xff) * uVar5) / 0xff | 0xff000000;
  cp = cp + 1;
  pp = pp + uVar3;
  goto LAB_0025d60c;
switchD_0025d356_default:
  uVar5 = pp[3] ^ 0xff;
  *cp = ((pp[2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
        ((pp[1] ^ 0xff) * uVar5) / 0xff << 8 | ((*pp ^ 0xff) * uVar5) / 0xff;
  uVar5 = pp[uVar3 + 3] ^ 0xff;
  cp[1] = ((pp[uVar3 + 2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
          ((pp[uVar3 + 1] ^ 0xff) * uVar5) / 0xff << 8 | ((pp[uVar3] ^ 0xff) * uVar5) / 0xff;
  uVar5 = pp[uVar3 * 2 + 3] ^ 0xff;
  cp[2] = ((pp[uVar3 * 2 + 2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
          ((pp[uVar3 * 2 + 1] ^ 0xff) * uVar5) / 0xff << 8 | ((pp[uVar3 * 2] ^ 0xff) * uVar5) / 0xff
  ;
  uVar5 = pp[lVar1 + 3] ^ 0xff;
  cp[3] = ((pp[lVar1 + 2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
          ((pp[lVar1 + 1] ^ 0xff) * uVar5) / 0xff << 8 | ((pp[lVar1] ^ 0xff) * uVar5) / 0xff;
  uVar5 = pp[uVar3 * 4 + 3] ^ 0xff;
  cp[4] = ((pp[uVar3 * 4 + 2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
          ((pp[uVar3 * 4 + 1] ^ 0xff) * uVar5) / 0xff << 8 | ((pp[uVar3 * 4] ^ 0xff) * uVar5) / 0xff
  ;
  uVar5 = pp[lVar2 + 3] ^ 0xff;
  cp[5] = ((pp[lVar2 + 2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
          ((pp[lVar2 + 1] ^ 0xff) * uVar5) / 0xff << 8 | ((pp[lVar2] ^ 0xff) * uVar5) / 0xff;
  uVar5 = pp[lVar7 + 3] ^ 0xff;
  cp[6] = ((pp[lVar7 + 2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
          ((pp[lVar7 + 1] ^ 0xff) * uVar5) / 0xff << 8 | ((pp[lVar7] ^ 0xff) * uVar5) / 0xff;
  uVar5 = pp[lVar4 + 3] ^ 0xff;
  cp[7] = ((pp[lVar4 + 2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
          ((pp[lVar4 + 1] ^ 0xff) * uVar5) / 0xff << 8 | ((pp[lVar4] ^ 0xff) * uVar5) / 0xff;
  pp = pp + uVar3 * 8;
  cp = cp + 8;
  uVar6 = uVar6 - 8;
  goto LAB_0025d063;
switchD_0025d356_caseD_0:
LAB_0025d60c:
  pp = pp + (long)fromskew * uVar3;
  cp = cp + toskew;
  goto LAB_0025d04f;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bitCMYKtile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t r, g, b, k;

    (void)x;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, k = 255 - pp[3]; r = (k * (255 - pp[0])) / 255;
                g = (k * (255 - pp[1])) / 255; b = (k * (255 - pp[2])) / 255;
                *cp++ = PACK(r, g, b); pp += samplesperpixel);
        cp += toskew;
        pp += fromskew;
    }
}